

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O0

Error asmjit::v1_14::x86::FormatterInternal::formatInstruction
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,BaseInst *inst,
                Operand_ *operands,size_t opCount)

{
  FormatFlags a;
  bool bVar1;
  Error EVar2;
  Error EVar3;
  uint *puVar4;
  uint in_ESI;
  String *in_RDI;
  FormatFlags *in_R8;
  long in_R9;
  ulong in_stack_00000008;
  Error _err_27;
  Error _err_26;
  uint32_t bits;
  Error _err_25;
  Error _err_24;
  Error _err_23;
  Error _err_22;
  Error _err_21;
  Error _err_20;
  Error _err_19;
  uint32_t j;
  uint32_t vecSize;
  Error _err_18;
  Error _err_17;
  Operand_ *op;
  uint32_t i;
  Error _err_16;
  Error _err_15;
  Error _err_14;
  Error _err_13;
  InstOptions kRXBWMask;
  Error _err_12;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  InstOptions options;
  InstId instId;
  InstId in_stack_fffffffffffffa5c;
  char in_stack_fffffffffffffa63;
  ModifyOp in_stack_fffffffffffffa64;
  String *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  char *in_stack_fffffffffffffa78;
  ModifyOp in_stack_fffffffffffffa84;
  uint in_stack_fffffffffffffa88;
  uint in_stack_fffffffffffffa8c;
  ModifyOp local_554;
  uint local_550;
  ModifyOp local_54c;
  InstId instId_00;
  FormatFlags in_stack_fffffffffffffacc;
  FormatFlags formatFlags_00;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  uint32_t in_stack_fffffffffffffad8;
  Error in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  FormatFlags local_518;
  FormatFlags in_stack_fffffffffffffaec;
  undefined4 uVar5;
  String *in_stack_fffffffffffffaf0;
  Error in_stack_fffffffffffffaf8;
  Error in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  FormatFlags in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 local_17c;
  uint *local_178;
  undefined4 local_170;
  ModifyOp *local_168;
  ModifyOp *local_160;
  uint *local_158;
  uint *local_150;
  FormatFlags *local_148;
  FormatFlags *local_140;
  FormatFlags *local_138;
  uint *local_130;
  undefined1 *local_128;
  uint *local_120;
  undefined4 local_114;
  undefined4 local_104;
  undefined4 local_f8;
  FormatFlags local_f4;
  FormatFlags *local_f0;
  FormatFlags *local_e8;
  uint *local_e0;
  uint *local_d8;
  uint *local_d0;
  uint *local_c8;
  uint *local_c0;
  uint *local_b8;
  uint *local_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  undefined4 *local_90;
  uint *local_88;
  FormatFlags *local_80;
  undefined4 local_74;
  FormatFlags *local_70;
  FormatFlags local_64;
  FormatFlags *local_60;
  FormatFlags *local_58;
  undefined4 local_4c;
  undefined4 local_48;
  FormatFlags local_44;
  FormatFlags *local_40;
  FormatFlags *local_38;
  undefined4 local_30;
  undefined4 local_2c;
  FormatFlags *local_28;
  FormatFlags *local_20;
  uint *local_18;
  undefined1 *local_10;
  uint *local_8;
  
  formatFlags_00 = *in_R8;
  a = in_R8[1];
  if (formatFlags_00 < 0x6bb) {
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_Vex);
    formatFlags_00 = in_stack_fffffffffffffacc;
    if ((bVar1) &&
       (EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
       formatFlags_00 = in_stack_fffffffffffffacc, EVar2 != 0)) {
      return EVar2;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_Vex3);
    if ((bVar1) &&
       (EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
       EVar2 != 0)) {
      return EVar2;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_Evex);
    if (bVar1) {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb1c = 0;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_ModRM);
    if (bVar1) {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb18 = 0;
    }
    else {
      bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_ModMR);
      if (bVar1) {
        EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_fffffffffffffb14 = kNone;
      }
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kShortForm);
    if ((bVar1) &&
       (EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
       EVar2 != 0)) {
      return EVar2;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kLongForm);
    if (bVar1) {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb0c = 0;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_XAcquire);
    if (bVar1) {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb08 = 0;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_XRelease);
    if (bVar1) {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb04 = 0;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_Lock);
    if ((bVar1) &&
       (EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
       EVar2 != 0)) {
      return EVar2;
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (a,kX86_Repne|kX86_Rep);
    if (bVar1) {
      in_stack_fffffffffffffa68 = in_RDI;
      Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_Rep);
      String::_opString((String *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                        in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                        CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      local_80 = in_R8 + 2;
      local_74 = 0;
      local_70 = local_80;
      if (*local_80 != kNone) {
        in_stack_fffffffffffffafc =
             String::_opString((String *)
                               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                               in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        if (in_stack_fffffffffffffafc != 0) {
          return in_stack_fffffffffffffafc;
        }
        local_60 = in_R8 + 2;
        in_stack_fffffffffffffaec = in_R8[3];
        local_58 = &local_518;
        local_48 = 0;
        local_4c = 0;
        local_518 = *local_60;
        uVar5 = 0;
        uVar5 = 0;
        local_64 = in_stack_fffffffffffffaec;
        local_44 = in_stack_fffffffffffffaec;
        local_40 = local_60;
        local_38 = local_58;
        in_stack_fffffffffffffaf8 =
             formatOperand((String *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                           in_stack_fffffffffffffb14,
                           (BaseEmitter *)
                           CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                           (Arch)((uint)in_stack_fffffffffffffb04 >> 0x18),
                           (Operand_ *)(ulong)in_stack_fffffffffffffaf8);
        if (in_stack_fffffffffffffaf8 != 0) {
          return in_stack_fffffffffffffaf8;
        }
        EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_fffffffffffffae4 = 0;
      }
    }
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_Rex);
    if (bVar1) {
      in_stack_fffffffffffffae0 = 0xf000000;
      bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (a,kX86_OpCodeW|kX86_OpCodeR|kX86_OpCodeX|kX86_OpCodeB);
      if (bVar1) {
        in_stack_fffffffffffffadc =
             String::_opString((String *)
                               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                               in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        if (in_stack_fffffffffffffadc != 0) {
          return in_stack_fffffffffffffadc;
        }
        bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_OpCodeR)
        ;
        if (bVar1) {
          String::_opChar(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                          in_stack_fffffffffffffa63);
        }
        bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_OpCodeX)
        ;
        if (bVar1) {
          String::_opChar(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                          in_stack_fffffffffffffa63);
        }
        bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_OpCodeB)
        ;
        if (bVar1) {
          String::_opChar(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                          in_stack_fffffffffffffa63);
        }
        bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_OpCodeW)
        ;
        if (bVar1) {
          String::_opChar(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                          in_stack_fffffffffffffa63);
        }
        String::_opChar(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                        in_stack_fffffffffffffa63);
      }
      else {
        EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_fffffffffffffad8 = 0;
      }
    }
    EVar2 = InstInternal::instIdToString(in_stack_fffffffffffffa5c,(String *)0x1d278d);
    if (EVar2 != 0) {
      return EVar2;
    }
    in_stack_fffffffffffffad4 = 0;
  }
  else {
    EVar2 = String::_opFormat(in_RDI,kAppend,"[InstId=#%u]",(ulong)formatFlags_00);
    if (EVar2 != 0) {
      return EVar2;
    }
    in_stack_fffffffffffffad0 = 0;
  }
  for (instId_00 = 0; instId_00 < in_stack_00000008; instId_00 = instId_00 + 1) {
    puVar4 = (uint *)(in_R9 + (ulong)instId_00 * 0x10);
    local_30 = 0;
    local_2c = 0;
    local_17c = 0;
    local_90 = &local_17c;
    local_178 = puVar4;
    local_88 = puVar4;
    if (*puVar4 == 0) break;
    EVar2 = String::_opString((String *)
                              CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                              in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                              CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    if (EVar2 != 0) {
      return EVar2;
    }
    EVar3 = formatOperand((String *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                          in_stack_fffffffffffffb14,
                          (BaseEmitter *)
                          CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                          (Arch)((uint)in_stack_fffffffffffffb04 >> 0x18),
                          (Operand_ *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8))
    ;
    if (EVar3 != 0) {
      return EVar3;
    }
    local_e0 = puVar4;
    local_b8 = puVar4;
    local_b0 = puVar4;
    if (((*puVar4 & 7) == 4) && (local_170 = 2, (in_ESI & 2) != 0)) {
      local_54c = 0x10;
      for (local_550 = 0; local_550 < in_stack_00000008; local_550 = local_550 + 1) {
        local_d0 = (uint *)(in_R9 + (ulong)local_550 * 0x10);
        if ((*local_d0 & 7) == 1) {
          local_158 = (uint *)(in_R9 + (ulong)local_550 * 0x10);
          local_554 = *local_158 >> 0x18;
          local_160 = &local_54c;
          local_168 = &local_554;
          in_stack_fffffffffffffa64 = local_54c;
          local_150 = local_158;
          local_98 = local_158;
          if (local_54c < local_554) {
            in_stack_fffffffffffffa64 = local_554;
            local_54c = local_554;
          }
        }
        local_c8 = local_d0;
        local_a0 = local_d0;
      }
      EVar2 = FormatterInternal_explainConst
                        ((String *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                         formatFlags_00,instId_00,(uint32_t)((ulong)puVar4 >> 0x20),
                         (Imm *)((ulong)EVar2 << 0x20));
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    if (instId_00 == 0) {
      local_148 = in_R8 + 2;
      local_28 = local_148;
      local_20 = local_148;
      if (((byte)(*local_148 >> 8) & 0xf) == 2) {
        EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                  CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        if (EVar2 != 0) {
          return EVar2;
        }
        local_140 = in_R8 + 2;
        local_138 = in_R8 + 2;
        local_f0 = local_140;
        local_e8 = local_140;
        EVar2 = formatRegister(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,
                               (BaseEmitter *)
                               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                               (Arch)(in_stack_fffffffffffffadc >> 0x18),
                               (RegType)(in_stack_fffffffffffffadc >> 0x10),
                               in_stack_fffffffffffffad8);
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = String::_opChar(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                                in_stack_fffffffffffffa63);
        if (EVar2 != 0) {
          return EVar2;
        }
        bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_ZMask);
        if (bVar1) {
          EVar2 = String::_opString((String *)
                                    CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                    in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                    CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
joined_r0x001d2f0d:
          if (EVar2 != 0) {
            return EVar2;
          }
        }
      }
      else {
        bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(a,kX86_ZMask);
        if (bVar1) {
          EVar2 = String::_opString((String *)
                                    CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                    in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                    CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
          goto joined_r0x001d2f0d;
        }
      }
    }
    local_d8 = puVar4;
    local_c0 = puVar4;
    local_a8 = puVar4;
    if (((*puVar4 & 7) == 2) && (local_130 = puVar4, local_18 = puVar4, (*puVar4 & 0xe00000) != 0))
    {
      in_stack_fffffffffffffa88 = *puVar4 >> 0x15 & 7;
      local_128 = &stack0xfffffffffffffa88;
      in_stack_fffffffffffffa8c = 1 << (sbyte)in_stack_fffffffffffffa88;
      local_120 = puVar4;
      local_10 = local_128;
      local_8 = puVar4;
      EVar2 = String::_opFormat(in_RDI,kAppend," {1to%u}",(ulong)in_stack_fffffffffffffa8c);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
  }
  local_104 = 0xc0000;
  bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                    (in_R8[1],kX86_SAE|kX86_ER);
  if (bVar1) {
    local_114 = 0x40000;
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(in_R8[1],kX86_ER);
    if (bVar1) {
      local_f4 = in_R8[1];
      local_f8 = 0x600000;
      EVar2 = String::_opFormat(in_RDI,kAppend,", {%s-sae}",
                                "rn" + ((local_f4 & 0x600000) >> 0x15) * 3);
    }
    else {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    }
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatInstruction(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const BaseInst& inst, const Operand_* operands, size_t opCount) noexcept {

  InstId instId = inst.id();
  InstOptions options = inst.options();

  // Format instruction options and instruction mnemonic.
  if (instId < Inst::_kIdCount) {
    // VEX|EVEX options.
    if (Support::test(options, InstOptions::kX86_Vex))
      ASMJIT_PROPAGATE(sb.append("{vex} "));

    if (Support::test(options, InstOptions::kX86_Vex3))
      ASMJIT_PROPAGATE(sb.append("{vex3} "));

    if (Support::test(options, InstOptions::kX86_Evex))
      ASMJIT_PROPAGATE(sb.append("{evex} "));

    // MOD/RM and MOD/MR options
    if (Support::test(options, InstOptions::kX86_ModRM))
      ASMJIT_PROPAGATE(sb.append("{modrm} "));
    else if (Support::test(options, InstOptions::kX86_ModMR))
      ASMJIT_PROPAGATE(sb.append("{modmr} "));

    // SHORT|LONG options.
    if (Support::test(options, InstOptions::kShortForm))
      ASMJIT_PROPAGATE(sb.append("short "));

    if (Support::test(options, InstOptions::kLongForm))
      ASMJIT_PROPAGATE(sb.append("long "));

    // LOCK|XACQUIRE|XRELEASE options.
    if (Support::test(options, InstOptions::kX86_XAcquire))
      ASMJIT_PROPAGATE(sb.append("xacquire "));

    if (Support::test(options, InstOptions::kX86_XRelease))
      ASMJIT_PROPAGATE(sb.append("xrelease "));

    if (Support::test(options, InstOptions::kX86_Lock))
      ASMJIT_PROPAGATE(sb.append("lock "));

    // REP|REPNE options.
    if (Support::test(options, InstOptions::kX86_Rep | InstOptions::kX86_Repne)) {
      sb.append(Support::test(options, InstOptions::kX86_Rep) ? "rep " : "repnz ");
      if (inst.hasExtraReg()) {
        ASMJIT_PROPAGATE(sb.append("{"));
        ASMJIT_PROPAGATE(formatOperand(sb, formatFlags, emitter, arch, inst.extraReg().toReg<BaseReg>()));
        ASMJIT_PROPAGATE(sb.append("} "));
      }
    }

    // REX options.
    if (Support::test(options, InstOptions::kX86_Rex)) {
      const InstOptions kRXBWMask = InstOptions::kX86_OpCodeR |
                                    InstOptions::kX86_OpCodeX |
                                    InstOptions::kX86_OpCodeB |
                                    InstOptions::kX86_OpCodeW ;
      if (Support::test(options, kRXBWMask)) {
        ASMJIT_PROPAGATE(sb.append("rex."));
        if (Support::test(options, InstOptions::kX86_OpCodeR)) sb.append('r');
        if (Support::test(options, InstOptions::kX86_OpCodeX)) sb.append('x');
        if (Support::test(options, InstOptions::kX86_OpCodeB)) sb.append('b');
        if (Support::test(options, InstOptions::kX86_OpCodeW)) sb.append('w');
        sb.append(' ');
      }
      else {
        ASMJIT_PROPAGATE(sb.append("rex "));
      }
    }

    ASMJIT_PROPAGATE(InstInternal::instIdToString(instId, sb));
  }
  else {
    ASMJIT_PROPAGATE(sb.appendFormat("[InstId=#%u]", unsigned(instId)));
  }

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.isNone()) break;

    ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
    ASMJIT_PROPAGATE(formatOperand(sb, formatFlags, emitter, arch, op));

    if (op.isImm() && uint32_t(formatFlags & FormatFlags::kExplainImms)) {
      uint32_t vecSize = 16;
      for (uint32_t j = 0; j < opCount; j++)
        if (operands[j].isReg())
          vecSize = Support::max<uint32_t>(vecSize, operands[j].as<Reg>().size());
      ASMJIT_PROPAGATE(FormatterInternal_explainConst(sb, formatFlags, instId, vecSize, op.as<Imm>()));
    }

    // Support AVX-512 masking - {k}{z}.
    if (i == 0) {
      if (inst.extraReg().group() == RegGroup::kX86_K) {
        ASMJIT_PROPAGATE(sb.append(" {"));
        ASMJIT_PROPAGATE(formatRegister(sb, formatFlags, emitter, arch, inst.extraReg().type(), inst.extraReg().id()));
        ASMJIT_PROPAGATE(sb.append('}'));

        if (Support::test(options, InstOptions::kX86_ZMask))
          ASMJIT_PROPAGATE(sb.append("{z}"));
      }
      else if (Support::test(options, InstOptions::kX86_ZMask)) {
        ASMJIT_PROPAGATE(sb.append(" {z}"));
      }
    }

    // Support AVX-512 broadcast - {1tox}.
    if (op.isMem() && op.as<Mem>().hasBroadcast()) {
      ASMJIT_PROPAGATE(sb.appendFormat(" {1to%u}", Support::bitMask(uint32_t(op.as<Mem>().getBroadcast()))));
    }
  }

  // Support AVX-512 embedded rounding and suppress-all-exceptions {sae}.
  if (inst.hasOption(InstOptions::kX86_ER | InstOptions::kX86_SAE)) {
    if (inst.hasOption(InstOptions::kX86_ER)) {
      uint32_t bits = uint32_t(inst.options() & InstOptions::kX86_ERMask) >> Support::ConstCTZ<uint32_t(InstOptions::kX86_ERMask)>::value;

      const char roundingModes[] = "rn\0rd\0ru\0rz";
      ASMJIT_PROPAGATE(sb.appendFormat(", {%s-sae}", roundingModes + bits * 3));
    }
    else {
      ASMJIT_PROPAGATE(sb.append(", {sae}"));
    }
  }

  return kErrorOk;
}